

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::D_formatter<spdlog::details::scoped_padder>::format
          (D_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  format_handler<char> *handler;
  size_t sVar1;
  byte bVar2;
  memory_buf_t *handler_00;
  buffer<char> *buf;
  uint uVar3;
  ulong uVar4;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  scoped_padder p;
  uint local_98 [6];
  scoped_padder local_80;
  char *local_58;
  undefined8 local_50;
  undefined4 local_48;
  memory_buf_t *local_40;
  undefined8 local_38;
  undefined1 *local_30;
  undefined8 local_28;
  
  handler_00 = dest;
  scoped_padder::scoped_padder(&local_80,8,&(this->super_flag_formatter).padinfo_,dest);
  uVar3 = tm_time->tm_mon + 1;
  if (uVar3 < 100) {
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar4 = sVar1 + 1;
    }
    bVar2 = (byte)((uVar3 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar1] = bVar2 | 0x30;
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar4 = sVar1 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar3 + bVar2 * -10 | 0x30;
  }
  else {
    local_58 = "{:02}";
    local_50 = 5;
    local_48 = 0;
    local_38 = 1;
    local_28 = 0;
    fmt.size_ = (size_t)&local_58;
    fmt.data_ = (char *)0x5;
    local_98[0] = uVar3;
    local_40 = dest;
    local_30 = (undefined1 *)local_98;
    ::fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
              ((detail *)"{:02}",fmt,(format_handler<char> *)handler_00);
  }
  sVar1 = (dest->super_buffer<char>).size_;
  uVar4 = sVar1 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar4) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
  }
  handler = (format_handler<char> *)(dest->super_buffer<char>).ptr_;
  (dest->super_buffer<char>).size_ = uVar4;
  *(undefined1 *)((long)&(handler->parse_ctx).fmt_.data_ + sVar1) = 0x2f;
  uVar3 = tm_time->tm_mday;
  if (uVar3 < 100) {
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar4 = sVar1 + 1;
    }
    bVar2 = (byte)((uVar3 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar1] = bVar2 | 0x30;
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar4 = sVar1 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar3 + bVar2 * -10 | 0x30;
  }
  else {
    local_58 = "{:02}";
    local_50 = 5;
    local_48 = 0;
    local_38 = 1;
    local_28 = 0;
    fmt_00.size_ = (size_t)&local_58;
    fmt_00.data_ = (char *)0x5;
    local_98[0] = uVar3;
    local_40 = dest;
    local_30 = (undefined1 *)local_98;
    ::fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
              ((detail *)"{:02}",fmt_00,handler);
  }
  sVar1 = (dest->super_buffer<char>).size_;
  uVar4 = sVar1 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar4) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar4;
  (dest->super_buffer<char>).ptr_[sVar1] = '/';
  uVar3 = tm_time->tm_year % 100;
  if (uVar3 < 100) {
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar4 = sVar1 + 1;
    }
    bVar2 = (byte)((uVar3 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar1] = bVar2 | 0x30;
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar4 = sVar1 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar3 + bVar2 * -10 | 0x30;
  }
  else {
    local_58 = "{:02}";
    local_50 = 5;
    local_48 = 0;
    local_38 = 1;
    local_28 = 0;
    fmt_01.size_ = (size_t)&local_58;
    fmt_01.data_ = (char *)0x5;
    local_98[0] = uVar3;
    local_40 = dest;
    local_30 = (undefined1 *)local_98;
    ::fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
              ((detail *)"{:02}",fmt_01,
               (format_handler<char> *)((ulong)(long)tm_time->tm_year >> 0x3f));
  }
  scoped_padder::~scoped_padder(&local_80);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 8;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_mon + 1, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_mday, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }